

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_fgetcsv(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_context *pCtx_00;
  int iVar1;
  char *pcVar2;
  char *local_90;
  int local_74;
  char *pcStack_70;
  int i;
  char *zPtr;
  int local_60;
  int escape;
  int encl;
  int delim;
  jx9_value *pArray;
  jx9_int64 nLen;
  jx9_int64 n;
  io_private *pDev;
  char *zLine;
  jx9_io_stream *pStream;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  pStream = (jx9_io_stream *)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if ((nArg < 1) || (iVar1 = jx9_value_is_resource(*apArg), iVar1 == 0)) {
    jx9_context_throw_error(pjStack_18,2,"Expecting an IO handle");
    jx9_result_bool(pjStack_18,0);
  }
  else {
    n = (jx9_int64)jx9_value_to_resource((jx9_value *)pStream->zName);
    pCtx_00 = pjStack_18;
    if (((long *)n == (long *)0x0) || (*(int *)(n + 0x34) != 0xfeac14)) {
      jx9_context_throw_error(pjStack_18,2,"Expecting an IO handle");
      jx9_result_bool(pjStack_18,0);
    }
    else {
      zLine = *(char **)n;
      if (zLine == (char *)0x0) {
        pcVar2 = jx9_function_name(pjStack_18);
        if (zLine == (char *)0x0) {
          local_90 = "null_stream";
        }
        else {
          local_90 = *(char **)zLine;
        }
        jx9_context_throw_error_format
                  (pCtx_00,2,
                   "IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE"
                   ,pcVar2,local_90);
        jx9_result_bool(pjStack_18,0);
      }
      else {
        pArray = (jx9_value *)0xffffffffffffffff;
        if (1 < apArg_local._4_4_) {
          pArray = (jx9_value *)jx9_value_to_int64(*(jx9_value **)&pStream->iVersion);
        }
        nLen = StreamReadLine((io_private *)n,(char **)&pDev,(jx9_int64)pArray);
        if (nLen < 1) {
          jx9_result_bool(pjStack_18,0);
        }
        else {
          escape = 0x2c;
          local_60 = 0x22;
          zPtr._4_4_ = 0x5c;
          if (2 < apArg_local._4_4_) {
            iVar1 = jx9_value_is_string((jx9_value *)pStream->xOpen);
            if ((iVar1 != 0) &&
               (pcStack_70 = jx9_value_to_string((jx9_value *)pStream->xOpen,&local_74),
               0 < local_74)) {
              escape = (int)*pcStack_70;
            }
            if (3 < apArg_local._4_4_) {
              iVar1 = jx9_value_is_string((jx9_value *)pStream->xOpenDir);
              if ((iVar1 != 0) &&
                 (pcStack_70 = jx9_value_to_string((jx9_value *)pStream->xOpenDir,&local_74),
                 0 < local_74)) {
                local_60 = (int)*pcStack_70;
              }
              if (((4 < apArg_local._4_4_) &&
                  (iVar1 = jx9_value_is_string((jx9_value *)pStream->xClose), iVar1 != 0)) &&
                 (pcStack_70 = jx9_value_to_string((jx9_value *)pStream->xClose,&local_74),
                 0 < local_74)) {
                zPtr._4_4_ = (int)*pcStack_70;
              }
            }
          }
          _encl = jx9_context_new_array(pjStack_18);
          if (_encl == (jx9_value *)0x0) {
            jx9_context_throw_error(pjStack_18,1,"JX9 is running out of memory");
            jx9_result_null(pjStack_18);
          }
          else {
            jx9ProcessCsv((char *)pDev,(int)nLen,escape,local_60,zPtr._4_4_,jx9CsvConsumer,_encl);
            jx9_result_value(pjStack_18,_encl);
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_fgetcsv(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const jx9_io_stream *pStream;
	const char *zLine;
	io_private *pDev;
	jx9_int64 n, nLen;
	if( nArg < 1 || !jx9_value_is_resource(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract our private data */
	pDev = (io_private *)jx9_value_to_resource(apArg[0]);
	/* Make sure we are dealing with a valid io_private instance */
	if( IO_PRIVATE_INVALID(pDev) ){
		/*Expecting an IO handle */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the target IO stream device */
	pStream = pDev->pStream;
	if( pStream == 0  ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE", 
			jx9_function_name(pCtx), pStream ? pStream->zName : "null_stream"
			);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	nLen = -1;
	if( nArg > 1 ){
		/* Maximum data to read */
		nLen = jx9_value_to_int64(apArg[1]);
	}
	/* Perform the requested operation */
	n = StreamReadLine(pDev, &zLine, nLen);
	if( n < 1 ){
		/* EOF or IO error, return FALSE */
		jx9_result_bool(pCtx, 0);
	}else{
		jx9_value *pArray;
		int delim  = ',';   /* Delimiter */
		int encl   = '"' ;  /* Enclosure */
		int escape = '\\';  /* Escape character */
		if( nArg > 2 ){
			const char *zPtr;
			int i;
			if( jx9_value_is_string(apArg[2]) ){
				/* Extract the delimiter */
				zPtr = jx9_value_to_string(apArg[2], &i);
				if( i > 0 ){
					delim = zPtr[0];
				}
			}
			if( nArg > 3 ){
				if( jx9_value_is_string(apArg[3]) ){
					/* Extract the enclosure */
					zPtr = jx9_value_to_string(apArg[3], &i);
					if( i > 0 ){
						encl = zPtr[0];
					}
				}
				if( nArg > 4 ){
					if( jx9_value_is_string(apArg[4]) ){
						/* Extract the escape character */
						zPtr = jx9_value_to_string(apArg[4], &i);
						if( i > 0 ){
							escape = zPtr[0];
						}
					}
				}
			}
		}
		/* Create our array */
		pArray = jx9_context_new_array(pCtx);
		if( pArray == 0 ){
			jx9_context_throw_error(pCtx, JX9_CTX_ERR, "JX9 is running out of memory");
			jx9_result_null(pCtx);
			return JX9_OK;
		}
		/* Parse the raw input */
		jx9ProcessCsv(zLine, (int)n, delim, encl, escape, jx9CsvConsumer, pArray);
		/* Return the freshly created array  */
		jx9_result_value(pCtx, pArray);
	}
	return JX9_OK;	
}